

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O1

void __thiscall
QGraphicsScenePrivate::gestureTargetsAtHotSpots
          (QGraphicsScenePrivate *this,QSet<QGesture_*> *gestures,GestureFlag flag,
          QHash<QGraphicsObject_*,_QSet<QGesture_*>_> *targets,QSet<QGraphicsObject_*> *itemsSet,
          QSet<QGesture_*> *normal,QSet<QGesture_*> *conflicts)

{
  QGraphicsObject *pQVar1;
  size_t sVar2;
  long *plVar3;
  QGraphicsItemPrivate *pQVar4;
  int *piVar5;
  ulong uVar6;
  bool bVar7;
  const_iterator cVar8;
  Node<QGesture_*,_QHashDummyValue> *pNVar9;
  long lVar10;
  const_iterator cVar11;
  long lVar12;
  undefined8 *puVar13;
  TryEmplaceResult *pTVar14;
  Data *pDVar15;
  ulong uVar16;
  undefined1 *puVar17;
  long in_FS_OFFSET;
  byte bVar18;
  QGraphicsObject *itemobj;
  QGraphicsItem *item;
  GestureType gestureType;
  QGesture *gesture;
  uchar local_d8 [8];
  QGraphicsItem *local_d0;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined1 *local_b8;
  GestureType local_a4;
  anon_struct_8_1_898a9ca8_for_storage local_a0;
  QHash<QGesture_*,_QHashDummyValue> local_98;
  QHashDummyValue local_89;
  TryEmplaceResult local_88 [3];
  ushort local_40;
  long local_38;
  
  bVar18 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_98.d = (Data *)0x0;
  pDVar15 = (gestures->q_hash).d;
  if (pDVar15 == (Data *)0x0) {
    pDVar15 = (Data *)0x0;
  }
  else if (pDVar15->spans->offsets[0] == 0xff) {
    uVar6 = 1;
    do {
      uVar16 = uVar6;
      if (pDVar15->numBuckets == uVar16) {
        pDVar15 = (Data *)0x0;
        uVar16 = 0;
        break;
      }
      uVar6 = uVar16 + 1;
    } while (pDVar15->spans[uVar16 >> 7].offsets[(uint)uVar16 & 0x7f] == 0xff);
    goto LAB_0061c75b;
  }
  uVar16 = 0;
LAB_0061c75b:
  if (uVar16 != 0 || pDVar15 != (Data *)0x0) {
    do {
      local_a0.data =
           *&pDVar15->spans[uVar16 >> 7].entries
             [pDVar15->spans[uVar16 >> 7].offsets[(uint)uVar16 & 0x7f]].storage.data;
      bVar7 = QGesture::hasHotSpot((QGesture *)local_a0.data);
      if (bVar7) {
        local_a4 = QGesture::gestureType((QGesture *)local_a0.data);
        local_b8 = &DAT_aaaaaaaaaaaaaaaa;
        local_c8 = 0xaaaaaaaa;
        uStack_c4 = 0xaaaaaaaa;
        uStack_c0 = 0xaaaaaaaa;
        uStack_bc = 0xaaaaaaaa;
        sVar2 = *(size_t *)((long)local_a0.data + 8);
        lVar12 = *(long *)&this->field_0x8;
        puVar13 = &DAT_00702c10;
        pTVar14 = local_88;
        for (lVar10 = 9; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pTVar14->iterator).i.d =
               (Data<QHashPrivate::Node<QGraphicsObject_*,_QSet<QGesture_*>_>_> *)*puVar13;
          puVar13 = puVar13 + (ulong)bVar18 * -2 + 1;
          pTVar14 = (TryEmplaceResult *)((long)pTVar14 + ((ulong)bVar18 * -2 + 1) * 8);
        }
        local_40 = local_40 & 0xfc00;
        plVar3 = *(long **)(*(long *)(lVar12 + 8) + 0x88);
        (**(code **)(*plVar3 + 0x68))(&local_c8,plVar3,sVar2 + 0x90,1,1);
        if (local_b8 != (undefined1 *)0x0) {
          puVar17 = (undefined1 *)0x0;
          do {
            local_d0 = *(QGraphicsItem **)(CONCAT44(uStack_bc,uStack_c0) + (long)puVar17 * 8);
            QGraphicsItem::isBlockedByModalPanel(local_d0,&local_d0);
            local_d8 = (uchar  [8])QGraphicsItem::toGraphicsObject(local_d0);
            if (local_d8 != (uchar  [8])0x0) {
              pQVar4 = (local_d0->d_ptr).d;
              cVar8 = QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::find
                                (&pQVar4->gestureContext,&local_a4);
              cVar11._M_node = (_Base_ptr)(pQVar4->gestureContext).d.d.ptr;
              if ((QMapData<std::map<Qt::GestureType,_QFlags<Qt::GestureFlag>,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QFlags<Qt::GestureFlag>_>_>_>_>
                   *)cVar11._M_node !=
                  (QMapData<std::map<Qt::GestureType,_QFlags<Qt::GestureFlag>,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QFlags<Qt::GestureFlag>_>_>_>_>
                   *)0x0) {
                cVar11._M_node =
                     &(((QMapData<std::map<Qt::GestureType,_QFlags<Qt::GestureFlag>,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QFlags<Qt::GestureFlag>_>_>_>_>
                         *)cVar11._M_node)->m)._M_t._M_impl.super__Rb_tree_header._M_header;
              }
              if ((cVar8.i._M_node != (const_iterator)cVar11._M_node) &&
                 ((flag == 0 || ((*(GestureFlag *)((long)cVar8.i._M_node + 0x24) & flag) != 0)))) {
                if ((local_98.d == (Data *)0x0) ||
                   (pNVar9 = QHashPrivate::Data<QHashPrivate::Node<QGesture*,QHashDummyValue>>::
                             findNode<QGesture*>((Data<QHashPrivate::Node<QGesture*,QHashDummyValue>>
                                                  *)local_98.d,(QGesture **)&local_a0),
                   pNVar9 == (Node<QGesture_*,_QHashDummyValue> *)0x0)) {
                  local_88[0].iterator.i.d =
                       (Data<QHashPrivate::Node<QGraphicsObject_*,_QSet<QGesture_*>_>_> *)
                       local_a0.data;
                  QHash<QGesture*,QHashDummyValue>::emplace<QHashDummyValue_const&>
                            ((QHash<QGesture*,QHashDummyValue> *)&local_98,(QGesture **)local_88,
                             &local_89);
                }
                else {
                  QHash<QGesture*,QHashDummyValue>::removeImpl<QGesture*>
                            ((QHash<QGesture*,QHashDummyValue> *)&local_98,(QGesture **)&local_a0);
                  if (conflicts != (QSet<QGesture_*> *)0x0) {
                    local_88[0].iterator.i.d =
                         (Data<QHashPrivate::Node<QGraphicsObject_*,_QSet<QGesture_*>_>_> *)
                         local_a0.data;
                    QHash<QGesture*,QHashDummyValue>::emplace<QHashDummyValue_const&>
                              ((QHash<QGesture*,QHashDummyValue> *)conflicts,(QGesture **)local_88,
                               &local_89);
                  }
                }
                if (targets != (QHash<QGraphicsObject_*,_QSet<QGesture_*>_> *)0x0) {
                  QHash<QGraphicsObject*,QSet<QGesture*>>::tryEmplace_impl<QGraphicsObject*const&>
                            (local_88,(QHash<QGraphicsObject*,QSet<QGesture*>> *)targets,
                             (QGraphicsObject **)local_d8);
                  pQVar1 = (QGraphicsObject *)((long)local_88[0].iterator.i.d + 0x20);
                  lVar12 = (local_88[0].iterator.i.bucket >> 7) * 0x90;
                  local_88[0].iterator.i.d =
                       (Data<QHashPrivate::Node<QGraphicsObject_*,_QSet<QGesture_*>_>_> *)
                       local_a0.data;
                  QHash<QGesture*,QHashDummyValue>::emplace<QHashDummyValue_const&>
                            ((QHash<QGesture*,QHashDummyValue> *)
                             (*(long *)(*(long *)pQVar1 + 0x80 + lVar12) +
                              (ulong)*(byte *)((ulong)((uint)local_88[0].iterator.i.bucket & 0x7f) +
                                              *(long *)pQVar1 + lVar12) * 0x10 + 8),
                             (QGesture **)local_88,&local_89);
                }
                if (itemsSet != (QSet<QGraphicsObject_*> *)0x0) {
                  local_88[0].iterator.i.d =
                       (Data<QHashPrivate::Node<QGraphicsObject_*,_QSet<QGesture_*>_>_> *)local_d8;
                  QHash<QGraphicsObject*,QHashDummyValue>::emplace<QHashDummyValue_const&>
                            ((QHash<QGraphicsObject*,QHashDummyValue> *)itemsSet,
                             (QGraphicsObject **)local_88,&local_89);
                }
              }
            }
            bVar7 = QGraphicsItem::isPanel(local_d0);
          } while ((!bVar7) && (puVar17 = puVar17 + 1, puVar17 < local_b8));
        }
        piVar5 = (int *)CONCAT44(uStack_c4,local_c8);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            QArrayData::deallocate((QArrayData *)CONCAT44(uStack_c4,local_c8),8,0x10);
          }
        }
      }
      do {
        if (pDVar15->numBuckets - 1 == uVar16) {
          uVar16 = 0;
          pDVar15 = (Data *)0x0;
          break;
        }
        uVar16 = uVar16 + 1;
      } while (pDVar15->spans[uVar16 >> 7].offsets[(uint)uVar16 & 0x7f] == 0xff);
    } while (uVar16 != 0 || pDVar15 != (Data *)0x0);
  }
  if (normal != (QSet<QGesture_*> *)0x0) {
    QHash<QGesture_*,_QHashDummyValue>::operator=(&normal->q_hash,&local_98);
  }
  QHash<QGesture_*,_QHashDummyValue>::~QHash(&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScenePrivate::gestureTargetsAtHotSpots(const QSet<QGesture *> &gestures,
                                              Qt::GestureFlag flag,
                                              QHash<QGraphicsObject *, QSet<QGesture *> > *targets,
                                              QSet<QGraphicsObject *> *itemsSet,
                                              QSet<QGesture *> *normal,
                                              QSet<QGesture *> *conflicts)
{
    QSet<QGesture *> normalGestures; // that are not in conflicted state.
    for (QGesture *gesture : gestures) {
        if (!gesture->hasHotSpot())
            continue;
        const Qt::GestureType gestureType = gesture->gestureType();
        const QList<QGraphicsItem *> items = itemsAtPosition(QPoint(), gesture->d_func()->sceneHotSpot, nullptr);
        for (int j = 0; j < items.size(); ++j) {
            QGraphicsItem *item = items.at(j);

            // Check if the item is blocked by a modal panel and use it as
            // a target instead of this item.
            (void) item->isBlockedByModalPanel(&item);

            if (QGraphicsObject *itemobj = item->toGraphicsObject()) {
                QGraphicsItemPrivate *d = item->QGraphicsItem::d_func();
                QMap<Qt::GestureType, Qt::GestureFlags>::const_iterator it =
                        d->gestureContext.constFind(gestureType);
                if (it != d->gestureContext.constEnd() && (!flag || (it.value() & flag))) {
                    if (normalGestures.contains(gesture)) {
                        normalGestures.remove(gesture);
                        if (conflicts)
                            conflicts->insert(gesture);
                    } else {
                        normalGestures.insert(gesture);
                    }
                    if (targets)
                        (*targets)[itemobj].insert(gesture);
                    if (itemsSet)
                        (*itemsSet).insert(itemobj);
                }
            }
            // Don't propagate through panels.
            if (item->isPanel())
                break;
        }
    }
    if (normal)
        *normal = normalGestures;
}